

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::mouseMoveEvent(QAbstractButton *this,QMouseEvent *e)

{
  long lVar1;
  QAbstractButtonPrivate *this_00;
  QMouseEvent QVar2;
  char cVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)e[0x44] & 1) == 0) ||
     (this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8,
     (this_00->field_0x28c & 0x40) == 0)) {
LAB_003bec23:
    QVar2 = (QMouseEvent)0x0;
  }
  else {
    QEventPoint::position();
    cVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
    if (((this_00->field_0x28c & 0x10) == 0) != (bool)cVar3) {
      QEventPoint::position();
      cVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (cVar3 != '\0') goto LAB_003bec28;
      goto LAB_003bec23;
    }
    setDown(this,(this_00->field_0x28c & 0x10) == 0);
    QWidget::repaint(&this->super_QWidget);
    if ((this_00->field_0x28c & 0x10) == 0) {
      QAbstractButtonPrivate::emitReleased(this_00);
    }
    else {
      QAbstractButtonPrivate::emitPressed(this_00);
    }
    QVar2 = (QMouseEvent)0x1;
  }
  e[0xc] = QVar2;
LAB_003bec28:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);
    if (!(e->buttons() & Qt::LeftButton) || !d->pressed) {
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint()) != d->down) {
        setDown(!d->down);
        repaint();
        if (d->down)
            d->emitPressed();
        else
            d->emitReleased();
        e->accept();
    } else if (!hitButton(e->position().toPoint())) {
        e->ignore();
    }
}